

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageColorContrast(Image *image,float contrast)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  float fVar4;
  Image image_00;
  undefined1 auVar5 [16];
  Color *pCVar6;
  uchar *puVar7;
  undefined8 unaff_RBP;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uchar uVar11;
  undefined8 unaff_R14;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined8 unaff_retaddr;
  undefined1 auVar22 [16];
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    image_00._8_8_ = unaff_RBP;
    image_00.data = (void *)unaff_R14;
    image_00._16_8_ = unaff_retaddr;
    pCVar6 = LoadImageColors(image_00);
    auVar5 = _DAT_0015d8c0;
    iVar2 = image->height;
    if (0 < (long)iVar2) {
      fVar14 = -100.0;
      if (-100.0 <= contrast) {
        fVar14 = contrast;
      }
      fVar15 = 100.0;
      if (fVar14 <= 100.0) {
        fVar15 = fVar14;
      }
      fVar14 = (fVar15 + 100.0) / 100.0;
      fVar14 = fVar14 * fVar14;
      uVar3 = image->width;
      puVar7 = &pCVar6->b;
      lVar8 = 0;
      fVar15 = (float)DAT_0015d8c0;
      fVar16 = DAT_0015d8c0._4_4_;
      fVar17 = DAT_0015d8c0._8_4_;
      fVar18 = DAT_0015d8c0._12_4_;
      do {
        if (0 < (int)uVar3) {
          uVar9 = 0;
          do {
            uVar1 = *(ushort *)(puVar7 + uVar9 * 4 + -2);
            auVar20._0_4_ = (float)(uVar1 & 0xff);
            auVar20._4_4_ = (float)(byte)(uVar1 >> 8);
            auVar20._8_8_ = 0;
            auVar20 = divps(auVar20,auVar5);
            auVar21._0_4_ = ((auVar20._0_4_ + -0.5) * fVar14 + 0.5) * fVar15;
            auVar21._4_4_ = ((auVar20._4_4_ + -0.5) * fVar14 + 0.5) * fVar16;
            auVar21._8_4_ = ((auVar20._8_4_ + 0.0) * fVar14 + 0.0) * fVar17;
            auVar21._12_4_ = ((auVar20._12_4_ + 0.0) * fVar14 + 0.0) * fVar18;
            auVar20 = maxps(ZEXT816(0),auVar21);
            iVar12 = -(uint)(fVar15 < auVar20._0_4_);
            iVar13 = -(uint)(fVar16 < auVar20._4_4_);
            auVar23._4_4_ = iVar13;
            auVar23._0_4_ = iVar12;
            auVar23._8_4_ = iVar13;
            auVar23._12_4_ = iVar13;
            auVar22._8_8_ = auVar23._8_8_;
            auVar22._4_4_ = iVar12;
            auVar22._0_4_ = iVar12;
            uVar10 = movmskpd((uint)uVar1,auVar22);
            fVar19 = (((float)puVar7[uVar9 * 4] / 255.0 + -0.5) * fVar14 + 0.5) * 255.0;
            fVar4 = 0.0;
            if (0.0 <= fVar19) {
              fVar4 = fVar19;
            }
            fVar19 = 255.0;
            if (fVar4 <= 255.0) {
              fVar19 = fVar4;
            }
            uVar11 = (uchar)(int)auVar20._0_4_;
            if ((uVar10 & 1) != 0) {
              uVar11 = 0xff;
            }
            puVar7[uVar9 * 4 + -2] = uVar11;
            uVar11 = (uchar)(int)auVar20._4_4_;
            if ((uVar10 & 2) != 0) {
              uVar11 = 0xff;
            }
            puVar7[uVar9 * 4 + -1] = uVar11;
            puVar7[uVar9 * 4] = (uchar)(int)fVar19;
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
        lVar8 = lVar8 + 1;
        puVar7 = puVar7 + (ulong)uVar3 * 4;
      } while (lVar8 != iVar2);
    }
    iVar2 = image->format;
    free(image->data);
    image->data = pCVar6;
    image->format = 7;
    ImageFormat(image,iVar2);
    return;
  }
  return;
}

Assistant:

void ImageColorContrast(Image *image, float contrast)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (contrast < -100) contrast = -100;
    if (contrast > 100) contrast = 100;

    contrast = (100.0f + contrast)/100.0f;
    contrast *= contrast;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            float pR = (float)pixels[y*image->width + x].r/255.0f;
            pR -= 0.5;
            pR *= contrast;
            pR += 0.5;
            pR *= 255;
            if (pR < 0) pR = 0;
            if (pR > 255) pR = 255;

            float pG = (float)pixels[y*image->width + x].g/255.0f;
            pG -= 0.5;
            pG *= contrast;
            pG += 0.5;
            pG *= 255;
            if (pG < 0) pG = 0;
            if (pG > 255) pG = 255;

            float pB = (float)pixels[y*image->width + x].b/255.0f;
            pB -= 0.5;
            pB *= contrast;
            pB += 0.5;
            pB *= 255;
            if (pB < 0) pB = 0;
            if (pB > 255) pB = 255;

            pixels[y*image->width + x].r = (unsigned char)pR;
            pixels[y*image->width + x].g = (unsigned char)pG;
            pixels[y*image->width + x].b = (unsigned char)pB;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}